

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

span<const_slang::SourceLibrary_*,_18446744073709551615UL> __thiscall
slang::BumpAllocator::copyFrom<slang::SourceLibrary_const*>
          (BumpAllocator *this,span<const_slang::SourceLibrary_*const,_18446744073709551615UL> src)

{
  __extent_storage<18446744073709551615UL> _Var1;
  pointer __dest;
  span<const_slang::SourceLibrary_*,_18446744073709551615UL> sVar2;
  
  _Var1 = src._M_extent._M_extent_value;
  if (_Var1._M_extent_value == 0) {
    _Var1._M_extent_value = 0;
    __dest = (pointer)0x0;
  }
  else {
    __dest = (pointer)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
    if (this->endPtr < __dest + _Var1._M_extent_value) {
      __dest = (pointer)allocateSlow(this,_Var1._M_extent_value * 8,8);
    }
    else {
      this->head->current = (byte *)(__dest + _Var1._M_extent_value);
    }
    memcpy(__dest,src._M_ptr,_Var1._M_extent_value * 8);
  }
  sVar2._M_extent._M_extent_value = _Var1._M_extent_value;
  sVar2._M_ptr = __dest;
  return sVar2;
}

Assistant:

[[nodiscard]] std::span<T> copyFrom(std::span<const T> src) {
        auto len = src.size();
        if (len == 0)
            return {};

        auto dest = reinterpret_cast<T*>(allocate(len * sizeof(T), alignof(T)));
        std::memcpy(dest, src.data(), len * sizeof(T));

        return std::span<T>(dest, len);
    }